

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false,_true>_>_>
::Delete_disposer::operator()(Delete_disposer *this,Entry *delete_this)

{
  Row_access<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false,_true>_>_>
  ::unlink(&this->col_->super_Row_access_option,(char *)delete_this);
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false,_true>_>_>_>
  ::destroy(&this->col_->entryPool_->entryPool_,delete_this);
  return;
}

Assistant:

void operator()(Entry* delete_this) {
      if constexpr (Master_matrix::Option_list::has_row_access) col_->unlink(delete_this);
      col_->entryPool_->destroy(delete_this);
    }